

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_xattr.c
# Opt level: O0

int fwrite_xattr(CURL *curl,char *url,int fd)

{
  int iVar1;
  char *value_00;
  bool bVar2;
  char *nurl;
  char *pcStack_38;
  CURLcode result;
  char *value;
  int local_28;
  int err;
  int i;
  int fd_local;
  char *url_local;
  CURL *curl_local;
  
  local_28 = 0;
  err = fd;
  _i = url;
  url_local = (char *)curl;
  value._4_4_ = xattr(fd,"user.creator","curl");
  while( true ) {
    bVar2 = false;
    if (value._4_4_ == 0) {
      bVar2 = mappings[local_28].attr != (char *)0x0;
    }
    if (!bVar2) break;
    pcStack_38 = (char *)0x0;
    iVar1 = curl_easy_getinfo(url_local,mappings[local_28].info,&stack0xffffffffffffffc8);
    if ((iVar1 == 0) && (pcStack_38 != (char *)0x0)) {
      value._4_4_ = xattr(err,mappings[local_28].attr,pcStack_38);
    }
    local_28 = local_28 + 1;
  }
  if (value._4_4_ == 0) {
    value_00 = stripcredentials(_i);
    if (value_00 == (char *)0x0) {
      return 1;
    }
    value._4_4_ = xattr(err,"user.xdg.origin.url",value_00);
    curl_free(value_00);
  }
  return value._4_4_;
}

Assistant:

int fwrite_xattr(CURL *curl, const char *url, int fd)
{
  int i = 0;
  int err = xattr(fd, "user.creator", "curl");

  /* loop through all xattr-curlinfo pairs and abort on a set error */
  while(!err && mappings[i].attr) {
    char *value = NULL;
    CURLcode result = curl_easy_getinfo(curl, mappings[i].info, &value);
    if(!result && value)
      err = xattr(fd, mappings[i].attr, value);
    i++;
  }
  if(!err) {
    char *nurl = stripcredentials(url);
    if(!nurl)
      return 1;
    err = xattr(fd, "user.xdg.origin.url", nurl);
    curl_free(nurl);
  }
  return err;
}